

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

void __thiscall GcHeap::GcHeapImpl::GcHeapImpl(GcHeapImpl *this)

{
  uint8_t *puVar1;
  uint8_t *heap;
  GcHeapImpl *this_local;
  
  this->number_of_pages = 8;
  std::
  unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
  ::unordered_map(&this->forwarding_addresses);
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector(&this->worklist);
  std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::list(&this->finalize_queue);
  puVar1 = MapTheHeap(this->number_of_pages);
  this->heap_start = puVar1;
  this->heap_end = this->heap_start + this->number_of_pages * 0x1000;
  this->tospace = this->heap_start;
  this->extent = ((long)this->heap_end - (long)this->heap_start) / 2;
  this->fromspace = this->heap_start + this->extent;
  this->top = this->fromspace;
  this->free = this->tospace;
  this->stress = false;
  this->gc_number = 0;
  if (this->heap_start < this->heap_end) {
    return;
  }
  __assert_fail("heap_start < heap_end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0xa7,"GcHeap::GcHeapImpl::GcHeapImpl()");
}

Assistant:

GcHeapImpl() {
    uint8_t *heap = MapTheHeap(number_of_pages);
    heap_start = heap;
    heap_end = heap_start + PAGE_SIZE * number_of_pages;
    tospace = heap_start;
    extent = (heap_end - heap_start) / 2;
    fromspace = heap_start + extent;
    top = fromspace;
    free = tospace;
    stress = false;
    gc_number = 0;
    assert(heap_start < heap_end);
  }